

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

TiXmlNode * __thiscall despot::util::tinyxml::TiXmlText::Clone(TiXmlText *this)

{
  TiXmlText *this_00;
  
  this_00 = (TiXmlText *)operator_new(0x58);
  TiXmlText(this_00,"");
  CopyTo(this,this_00);
  return &this_00->super_TiXmlNode;
}

Assistant:

TiXmlNode* TiXmlText::Clone() const {
	TiXmlText* clone = 0;
	clone = new TiXmlText("");

	if (!clone)
		return 0;

	CopyTo(clone);
	return clone;
}